

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOLinker::ScanDependencies
          (cmBinUtilsMacOSMachOLinker *this,string *file,TargetType type)

{
  string *psVar1;
  ulong uVar2;
  FileInfo *libs;
  FileInfo *file_info;
  undefined1 local_78 [8];
  string executablePath;
  undefined1 local_48 [8];
  string executableFile;
  TargetType type_local;
  string *file_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  executableFile.field_2._12_4_ = type;
  std::__cxx11::string::string((string *)local_48);
  if (executableFile.field_2._12_4_ == 0) {
    std::__cxx11::string::operator=((string *)local_48,(string *)file);
  }
  else {
    psVar1 = cmRuntimeDependencyArchive::GetBundleExecutable_abi_cxx11_
                       ((this->super_cmBinUtilsLinker).Archive);
    std::__cxx11::string::operator=((string *)local_48,(string *)psVar1);
  }
  std::__cxx11::string::string((string *)local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::GetFilenamePath((string *)&file_info,(string *)local_48);
    std::__cxx11::string::operator=((string *)local_78,(string *)&file_info);
    std::__cxx11::string::~string((string *)&file_info);
  }
  libs = GetFileInfo(this,file);
  if (libs == (FileInfo *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = ScanDependencies(this,file,&libs->libs,&libs->rpaths,(string *)local_78);
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType type)
{
  std::string executableFile;
  if (type == cmStateEnums::EXECUTABLE) {
    executableFile = file;
  } else {
    executableFile = this->Archive->GetBundleExecutable();
  }
  std::string executablePath;
  if (!executableFile.empty()) {
    executablePath = cmSystemTools::GetFilenamePath(executableFile);
  }
  const FileInfo* file_info = this->GetFileInfo(file);
  if (file_info == nullptr) {
    return false;
  }
  return this->ScanDependencies(file, file_info->libs, file_info->rpaths,
                                executablePath);
}